

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

fdb_status compactor_register_file(filemgr *file,fdb_config *config,err_log_callback *log_callback)

{
  char *__dest;
  undefined8 in_RDX;
  void *in_RSI;
  avl_node *in_RDI;
  compactor_meta meta;
  char path [1024];
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  fdb_status fs;
  file_status_t fstatus;
  char *in_stack_fffffffffffff278;
  char *in_stack_fffffffffffff280;
  avl_cmp_func *in_stack_fffffffffffff288;
  avl_node *in_stack_fffffffffffff290;
  avl_tree *in_stack_fffffffffffff298;
  avl_node *in_stack_fffffffffffff2a0;
  avl_tree *in_stack_fffffffffffff2a8;
  err_log_callback *in_stack_fffffffffffff898;
  compactor_meta *in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  char local_570 [1344];
  avl_node *local_30;
  fdb_status local_28;
  file_status_t local_21;
  undefined8 local_20;
  void *local_18;
  avl_node *local_10;
  fdb_status local_4;
  
  local_28 = FDB_RESULT_SUCCESS;
  local_30 = (avl_node *)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_21 = filemgr_get_file_status((filemgr *)0x11b4a3);
  if ((local_21 == '\x01') || (local_21 == '\x04')) {
    local_4 = local_28;
  }
  else {
    strcpy(local_570,(char *)local_10->parent);
    pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
    local_30 = avl_search(in_stack_fffffffffffff298,in_stack_fffffffffffff290,
                          in_stack_fffffffffffff288);
    if (local_30 == (avl_node *)0x0) {
      __dest = (char *)calloc(1,0x540);
      strcpy(__dest,(char *)local_10->parent);
      *(avl_node **)(__dest + 0x400) = local_10;
      memcpy(__dest + 0x408,local_18,0xf8);
      __dest[0x434] = '\0';
      __dest[0x500] = '\x01';
      __dest[0x501] = '\0';
      __dest[0x502] = '\0';
      __dest[0x503] = '\0';
      __dest[0x504] = '\0';
      __dest[0x505] = '\0';
      __dest[0x506] = '\0';
      *(undefined8 *)(__dest + 0x508) = local_20;
      gettimeofday((timeval *)(__dest + 0x528),(__timezone_ptr_t)0x0);
      *(size_t *)(__dest + 0x538) = sleep_duration;
      avl_insert(in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
                 (avl_cmp_func *)in_stack_fffffffffffff298);
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
      _compactor_convert_dbfile_to_metafile(in_stack_fffffffffffff280,in_stack_fffffffffffff278);
      _strcpy_fname(in_stack_fffffffffffff280,in_stack_fffffffffffff278);
      local_28 = _compactor_store_metafile
                           (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                            in_stack_fffffffffffff898);
    }
    else {
      if (local_30[-0xc].right == (avl_node *)0x0) {
        local_30[-0xc].right = local_10;
      }
      *(int *)&local_30[-1].left = *(int *)&local_30[-1].left + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

fdb_status compactor_register_file(struct filemgr *file,
                                   fdb_config *config,
                                   err_log_callback *log_callback)
{
    file_status_t fstatus;
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    // Ignore files whose status is COMPACT_OLD or REMOVED_PENDING.
    // Those files do not need to be compacted again.
    fstatus = filemgr_get_file_status(file);
    if (fstatus == FILE_COMPACT_OLD ||
        fstatus == FILE_REMOVED_PENDING) {
        return fs;
    }

    strcpy(query.filename, file->filename);
    // first search the existing file
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a == NULL) {
        // doesn't exist
        // create elem and insert into tree
        char path[MAX_FNAMELEN];
        struct compactor_meta meta;

        elem = (struct openfiles_elem *)calloc(1, sizeof(struct openfiles_elem));
        strcpy(elem->filename, file->filename);
        elem->file = file;
        elem->config = *config;
        elem->config.cleanup_cache_onclose = false; // prevent MB-16422
        elem->register_count = 1;
        elem->compaction_flag = false;
        elem->daemon_compact_in_progress = false;
        elem->removal_activated = false;
        elem->log_callback = log_callback;
        gettimeofday(&elem->last_compaction_timestamp, NULL);
        // Init the compaction interval using the global param
        elem->interval = sleep_duration;
        avl_insert(&openfiles, &elem->avl, _compactor_cmp);
        mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as
                                 // subsequent registration attempts for the same file
                                 // will be simply processed by incrementing its
                                 // counter below.

        // store in metafile
        _compactor_convert_dbfile_to_metafile(file->filename, path);
        _strcpy_fname(meta.filename, file->filename);
        fs = _compactor_store_metafile(path, &meta, log_callback);
    } else {
        // already exists
        elem = _get_entry(a, struct openfiles_elem, avl);
        if (!elem->file) {
            elem->file = file;
        }
        elem->register_count++;
        mutex_unlock(&cpt_lock);
    }
    return fs;
}